

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c++
# Opt level: O2

void capnp::compiler::anon_unknown_0::buildTokenSequenceList
               (Builder builder,Array<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *items)

{
  Array<capnp::Orphan<capnp::compiler::Token>_> *pAVar1;
  uint index;
  uint uVar2;
  Builder BStack_58;
  
  for (uVar2 = 0; (ulong)uVar2 < items->size_; uVar2 = uVar2 + 1) {
    pAVar1 = items->ptr;
    List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Builder::init
              (&BStack_58,(EVP_PKEY_CTX *)&builder);
    for (index = 0; (ulong)index < pAVar1[uVar2].size_; index = index + 1) {
      List<capnp::compiler::Token,_(capnp::Kind)3>::Builder::adoptWithCaveats
                ((Builder *)&BStack_58,index,pAVar1[uVar2].ptr + index);
    }
  }
  return;
}

Assistant:

void buildTokenSequenceList(List<List<Token>>::Builder builder,
                            kj::Array<kj::Array<Orphan<Token>>>&& items) {
  for (uint i = 0; i < items.size(); i++) {
    auto& item = items[i];
    auto itemBuilder = builder.init(i, item.size());
    for (uint j = 0; j < item.size(); j++) {
      itemBuilder.adoptWithCaveats(j, kj::mv(item[j]));
    }
  }
}